

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_ordered.h
# Opt level: O2

Counts * __thiscall
wasm::InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>::
operator[](InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts>
           *this,Function **k)

{
  __node_base *p_Var1;
  Function *pFVar2;
  _Hash_node_base _Var3;
  _Hash_node_base *p_Var4;
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var5;
  __node_ptr p_Var6;
  __node_ptr p_Var7;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var8;
  _List_node_base *p_Var9;
  ulong uVar10;
  size_type __n;
  ulong uVar11;
  size_type sVar12;
  _Hash_node_base _Var13;
  __node_ptr p_Var14;
  undefined1 auVar15 [16];
  pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts> kv;
  __node_base_ptr p_Stack_78;
  _List_node_base local_70;
  undefined8 local_60;
  InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> *local_58;
  __node_ptr local_50;
  size_t local_48;
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_40;
  allocator_type local_31 [8];
  __buckets_alloc_type __alloc;
  
  kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)&p_Stack_78;
  p_Stack_78 = (__node_base_ptr)0x0;
  local_70._M_next = &local_70;
  local_60 = 0;
  pFVar2 = *k;
  local_70._M_prev = local_70._M_next;
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv,
             (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)
             ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     ._M_impl._M_node + 0x10));
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::~InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)
             ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     ._M_impl._M_node + 0x10));
  kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = (size_t)this;
  p_Var6 = (__node_ptr)operator_new(0x18);
  (p_Var6->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  local_58 = this + 0x38;
  *(Function **)
   &(p_Var6->
    super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
    ).
    super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
    ._M_storage._M_storage = pFVar2;
  *(InsertOrderedMap<wasm::Function_*,_wasm::ModuleUtils::(anonymous_namespace)::Counts> **)
   ((long)&(p_Var6->
           super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
           ).
           super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
           ._M_storage._M_storage + 8) = local_58;
  uVar11 = *(ulong *)(this + 8);
  uVar10 = (ulong)pFVar2 % uVar11;
  local_40 = (_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)this;
  p_Var7 = std::
           _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::_M_find_node((_Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)this,uVar10,
                          (key_type *)
                          &p_Var6->
                           super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                          ,(__hash_code)
                           &p_Var6->
                            super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                         );
  p_Var14 = p_Var7;
  if (p_Var7 == (__node_ptr)0x0) {
    local_48 = (local_40->_M_rehash_policy)._M_next_resize;
    local_50 = p_Var7;
    auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&local_40->_M_rehash_policy,uVar11,local_40->_M_element_count);
    p_Var5 = local_40;
    __n = auVar15._8_8_;
    if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __s = local_40->_M_buckets;
    }
    else {
      if (__n == 1) {
        __s = &local_40->_M_single_bucket;
        local_40->_M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = std::allocator_traits<std::allocator<std::__detail::_Hash_node_base_*>_>::allocate
                        (local_31,__n);
        memset(__s,0,__n * 8);
      }
      p_Var1 = &p_Var5->_M_before_begin;
      _Var3._M_nxt = (p_Var5->_M_before_begin)._M_nxt;
      (p_Var5->_M_before_begin)._M_nxt = (_Hash_node_base *)0x0;
      uVar11 = 0;
LAB_00ad085c:
      _Var13._M_nxt = _Var3._M_nxt;
      uVar10 = uVar11;
      if (_Var13._M_nxt != (_Hash_node_base *)0x0) {
        _Var3._M_nxt = (_Var13._M_nxt)->_M_nxt;
        uVar11 = (ulong)_Var13._M_nxt[1]._M_nxt % __n;
        if (__s[uVar11] == (_Hash_node_base *)0x0) goto LAB_00ad088b;
        (_Var13._M_nxt)->_M_nxt = __s[uVar11]->_M_nxt;
        pp_Var8 = &__s[uVar11]->_M_nxt;
        uVar11 = uVar10;
        goto LAB_00ad08a2;
      }
      std::
      _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_deallocate_buckets(p_Var5);
      p_Var5->_M_bucket_count = __n;
      p_Var5->_M_buckets = __s;
      uVar10 = (ulong)pFVar2 % __n;
    }
    if (__s[uVar10] == (_Hash_node_base *)0x0) {
      p_Var4 = (p_Var5->_M_before_begin)._M_nxt;
      (p_Var6->super__Hash_node_base)._M_nxt = p_Var4;
      (p_Var5->_M_before_begin)._M_nxt = (_Hash_node_base *)p_Var6;
      if (p_Var4 != (_Hash_node_base *)0x0) {
        __s[(ulong)p_Var4[1]._M_nxt % p_Var5->_M_bucket_count] = (__node_base_ptr)p_Var6;
        __s = p_Var5->_M_buckets;
      }
      __s[uVar10] = &p_Var5->_M_before_begin;
    }
    else {
      (p_Var6->super__Hash_node_base)._M_nxt = __s[uVar10]->_M_nxt;
      __s[uVar10]->_M_nxt = (_Hash_node_base *)p_Var6;
    }
    p_Var5->_M_element_count = p_Var5->_M_element_count + 1;
    p_Var7 = p_Var6;
    p_Var14 = local_50;
  }
  std::
  _Hashtable<wasm::Function_*,_std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_std::allocator<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Function_*>,_std::hash<wasm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Scoped_node::~_Scoped_node
            ((_Scoped_node *)
             ((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
                     super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                     ._M_impl._M_node + 0x10));
  if (p_Var14 == (__node_ptr)0x0) {
    p_Var9 = (_List_node_base *)operator_new(0x68);
    p_Var5 = local_40;
    kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.List.
    super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
    ._M_impl._M_node._M_size = (size_t)local_58;
    p_Var9[1]._M_next = (_List_node_base *)pFVar2;
    InsertOrderedMap<wasm::HeapType,_unsigned_long>::InsertOrderedMap
              ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&p_Var9[1]._M_prev,
               (InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv);
    std::
    __allocated_ptr<std::allocator<std::_List_node<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_List_node<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
                        *)((long)&kv.second.super_InsertOrderedMap<wasm::HeapType,_unsigned_long>.
                                  List.
                                  super__List_base<std::pair<const_wasm::HeapType,_unsigned_long>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_long>_>_>
                                  ._M_impl._M_node + 0x10));
    std::__detail::_List_node_base::_M_hook(p_Var9);
    p_Var1 = &p_Var5[1]._M_before_begin;
    p_Var1->_M_nxt = (_Hash_node_base *)((long)&p_Var1->_M_nxt->_M_nxt + 1);
    sVar12 = p_Var5[1]._M_bucket_count;
    *(size_type *)
     ((long)&(p_Var7->
             super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
             ).
             super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
             ._M_storage._M_storage + 8) = sVar12;
  }
  else {
    sVar12 = *(size_type *)
              ((long)&(p_Var7->
                      super__Hash_node_value<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>,_false>
                      ).
                      super__Hash_node_value_base<std::pair<wasm::Function_*const,_std::_List_iterator<std::pair<wasm::Function_*const,_wasm::ModuleUtils::(anonymous_namespace)::Counts>_>_>_>
                      ._M_storage._M_storage + 8);
  }
  InsertOrderedMap<wasm::HeapType,_unsigned_long>::~InsertOrderedMap
            ((InsertOrderedMap<wasm::HeapType,_unsigned_long> *)&kv);
  return (Counts *)(sVar12 + 0x18);
LAB_00ad088b:
  (_Var13._M_nxt)->_M_nxt = p_Var1->_M_nxt;
  p_Var1->_M_nxt = _Var13._M_nxt;
  __s[uVar11] = p_Var1;
  if ((_Var13._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
    pp_Var8 = __s + uVar10;
LAB_00ad08a2:
    *pp_Var8 = _Var13._M_nxt;
  }
  goto LAB_00ad085c;
}

Assistant:

T& operator[](const Key& k) {
    std::pair<const Key, T> kv = {k, {}};
    return insert(kv).first->second;
  }